

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall Js::JSONStringifier::ReadSpace(JSONStringifier *this,Var space)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  JavascriptString *spaceString;
  ulong uVar6;
  charcount_t cVar7;
  Type TVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  
  if (space != (Var)0x0) {
    uVar6 = (ulong)space & 0xffff000000000000;
    bVar9 = uVar6 == 0x1000000000000;
    bVar10 = ((ulong)space & 0x1ffff00000000) != 0x1000000000000;
    if (bVar10 && bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00b74d7d;
      *puVar5 = 0;
    }
    TVar8 = TypeIds_FirstNumberType;
    if ((uVar6 != 0x1000000000000) && (TVar8 = TypeIds_Number, (ulong)space >> 0x32 == 0)) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(space);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00b74d7d;
        *puVar5 = 0;
      }
      TVar8 = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00b74d7d;
        *puVar5 = 0;
      }
    }
    cVar7 = (charcount_t)space;
    if ((int)TVar8 < 7) {
      if (2 < TVar8 - TypeIds_Number) {
        if (TVar8 != TypeIds_FirstNumberType) {
          return;
        }
        if (bVar10 && bVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar9) goto LAB_00b74d7d;
          *puVar5 = 0;
        }
        if (uVar6 != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'")
          ;
          if (!bVar9) goto LAB_00b74d7d;
          *puVar5 = 0;
        }
        cVar4 = 10;
        if ((int)cVar7 < 10) {
          cVar4 = cVar7;
        }
        cVar7 = 0;
        if (0 < (int)cVar4) {
          cVar7 = cVar4;
        }
        goto LAB_00b74d39;
      }
    }
    else {
      if (TVar8 == TypeIds_String) {
        spaceString = UnsafeVarTo<Js::JavascriptString>(space);
LAB_00b74d67:
        SetStringGap(this,spaceString);
        return;
      }
      if (TVar8 != TypeIds_NumberObject) {
        if (TVar8 != TypeIds_StringObject) {
          return;
        }
        spaceString = JavascriptConversion::ToString(space,this->scriptContext);
        goto LAB_00b74d67;
      }
    }
    scriptContext = this->scriptContext;
    if (bVar10 && bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar9) {
LAB_00b74d7d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (uVar6 == 0x1000000000000) {
      dVar11 = (double)(int)cVar7;
    }
    else {
      dVar11 = JavascriptConversion::ToInteger_Full(space,scriptContext);
    }
    if (0.0 < dVar11) {
      if (10.0 <= dVar11) {
        dVar11 = 10.0;
      }
      cVar7 = (charcount_t)(long)dVar11;
LAB_00b74d39:
      SetNumericGap(this,cVar7);
      return;
    }
  }
  return;
}

Assistant:

void
JSONStringifier::ReadSpace(_In_opt_ Var space)
{
    if (space != nullptr)
    {
        switch (JavascriptOperators::GetTypeId(space))
        {
        case TypeIds_Integer:
            this->SetNumericGap(static_cast<charcount_t>(max(0, min(static_cast<int>(MaxGapLength), TaggedInt::ToInt32(space)))));

            break;
        case TypeIds_Number:
        case TypeIds_NumberObject:
        case TypeIds_Int64Number:
        case TypeIds_UInt64Number:
        {
            double numericSpace = JavascriptConversion::ToInteger(space, this->scriptContext);
            if (numericSpace > 0)
            {
                SetNumericGap(numericSpace < static_cast<double>(MaxGapLength) ? static_cast<charcount_t>(numericSpace) : MaxGapLength);
            }
            break;
        }
        case TypeIds_String:
            this->SetStringGap(UnsafeVarTo<JavascriptString>(space));
            break;
        case TypeIds_StringObject:
            this->SetStringGap(JavascriptConversion::ToString(space, this->scriptContext));
            break;
        default:
            break;
        }
    }
}